

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::NullTypeHandlerBase::DeleteProperty
          (NullTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags flags)

{
  bool bVar1;
  BOOL BVar2;
  uint32 local_34;
  ScriptContext *pSStack_30;
  uint32 indexVal;
  ScriptContext *scriptContext;
  PropertyOperationFlags flags_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  scriptContext._0_4_ = flags;
  scriptContext._4_4_ = propertyId;
  _flags_local = instance;
  instance_local = (DynamicObject *)this;
  pSStack_30 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  bVar1 = DynamicObject::HasObjectArray(_flags_local);
  if ((bVar1) &&
     (BVar2 = ScriptContext::IsNumericPropertyId(pSStack_30,scriptContext._4_4_,&local_34),
     BVar2 != 0)) {
    this_local._4_4_ =
         DynamicTypeHandler::DeleteItem
                   (&this->super_DynamicTypeHandler,_flags_local,local_34,
                    (PropertyOperationFlags)scriptContext);
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL NullTypeHandlerBase::DeleteProperty(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags flags)
    {
        // Check numeric propertyId only if objectArray is available
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return DynamicTypeHandler::DeleteItem(instance, indexVal, flags);
        }

        return true;
    }